

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O0

void helper_sysret_x86_64(CPUX86State *env,int dflag)

{
  uint uVar1;
  uintptr_t unaff_retaddr;
  int selector;
  int cpl;
  int dflag_local;
  CPUX86State *env_local;
  
  if ((env->efer & 1) == 0) {
    raise_exception_err_ra_x86_64(env,6,0,unaff_retaddr);
  }
  if (((env->cr[0] & 1) != 0) && ((env->hflags & 3) == 0)) {
    uVar1 = (uint)(ushort)(env->star >> 0x30);
    if ((env->hflags & 0x4000) == 0) {
      env->eflags = env->eflags | 0x200;
      cpu_x86_load_seg_cache(env,1,uVar1 | 3,0,0xffffffff,0xc0fb00);
      env->eip = env->regs[1] & 0xffffffff;
      cpu_x86_load_seg_cache(env,2,uVar1 + 8 | 3,0,0xffffffff,0xc0f300);
    }
    else {
      cpu_load_eflags(env,(int)env->regs[0xb],0x277300);
      if (dflag == 2) {
        cpu_x86_load_seg_cache(env,1,uVar1 + 0x10 | 3,0,0xffffffff,0xa0fb00);
        env->eip = env->regs[1];
      }
      else {
        cpu_x86_load_seg_cache(env,1,uVar1 | 3,0,0xffffffff,0xc0fb00);
        env->eip = env->regs[1] & 0xffffffff;
      }
      cpu_x86_load_seg_cache(env,2,uVar1 + 8 | 3,0,0xffffffff,0xc0f300);
    }
    return;
  }
  raise_exception_err_ra_x86_64(env,0xd,0,unaff_retaddr);
}

Assistant:

void helper_sysret(CPUX86State *env, int dflag)
{
    int cpl, selector;

    if (!(env->efer & MSR_EFER_SCE)) {
        raise_exception_err_ra(env, EXCP06_ILLOP, 0, GETPC());
    }
    cpl = env->hflags & HF_CPL_MASK;
    if (!(env->cr[0] & CR0_PE_MASK) || cpl != 0) {
        raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
    }
    selector = (env->star >> 48) & 0xffff;
    if (env->hflags & HF_LMA_MASK) {
        cpu_load_eflags(env, (uint32_t)(env->regs[11]), TF_MASK | AC_MASK
                        | ID_MASK | IF_MASK | IOPL_MASK | VM_MASK | RF_MASK |
                        NT_MASK);
        if (dflag == 2) {
            cpu_x86_load_seg_cache(env, R_CS, (selector + 16) | 3,
                                   0, 0xffffffff,
                                   DESC_G_MASK | DESC_P_MASK |
                                   DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                                   DESC_CS_MASK | DESC_R_MASK | DESC_A_MASK |
                                   DESC_L_MASK);
            env->eip = env->regs[R_ECX];
        } else {
            cpu_x86_load_seg_cache(env, R_CS, selector | 3,
                                   0, 0xffffffff,
                                   DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                                   DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                                   DESC_CS_MASK | DESC_R_MASK | DESC_A_MASK);
            env->eip = (uint32_t)env->regs[R_ECX];
        }
        cpu_x86_load_seg_cache(env, R_SS, (selector + 8) | 3,
                               0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_W_MASK | DESC_A_MASK);
    } else {
        env->eflags |= IF_MASK;
        cpu_x86_load_seg_cache(env, R_CS, selector | 3,
                               0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_CS_MASK | DESC_R_MASK | DESC_A_MASK);
        env->eip = (uint32_t)env->regs[R_ECX];
        cpu_x86_load_seg_cache(env, R_SS, (selector + 8) | 3,
                               0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_W_MASK | DESC_A_MASK);
    }
}